

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall
CLI::App::help(string *__return_storage_ptr__,App *this,string *prev,AppFormatMode mode)

{
  App *this_00;
  bool bVar1;
  ulong uVar2;
  string *psVar3;
  reference ppAVar4;
  element_type *peVar5;
  string local_b8 [36];
  undefined4 local_94;
  string local_90;
  undefined1 local_70 [8];
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> selected_subcommands;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  AppFormatMode local_24;
  string *psStack_20;
  AppFormatMode mode_local;
  string *prev_local;
  App *this_local;
  
  local_24 = mode;
  psStack_20 = prev;
  prev_local = (string *)this;
  this_local = (App *)__return_storage_ptr__;
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    psVar3 = get_name_abi_cxx11_(this);
    ::std::operator+(&local_48," ",psVar3);
    ::std::__cxx11::string::operator+=((string *)prev,(string *)&local_48);
    ::std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    psVar3 = get_name_abi_cxx11_(this);
    ::std::__cxx11::string::operator=((string *)prev,(string *)psVar3);
  }
  get_subcommands((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)local_70,this);
  bVar1 = std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::empty
                    ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)local_70);
  if (bVar1) {
    peVar5 = std::__shared_ptr_access<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->formatter_);
    ::std::__cxx11::string::string(local_b8,(string *)prev);
    (*peVar5->_vptr_FormatterBase[2])(__return_storage_ptr__,peVar5,this,local_b8,(ulong)local_24);
    ::std::__cxx11::string::~string(local_b8);
  }
  else {
    ppAVar4 = std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::back
                        ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)local_70);
    this_00 = *ppAVar4;
    ::std::__cxx11::string::string((string *)&local_90,(string *)prev);
    help(__return_storage_ptr__,this_00,&local_90,local_24);
    ::std::__cxx11::string::~string((string *)&local_90);
  }
  local_94 = 1;
  std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::~vector
            ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)local_70);
  return __return_storage_ptr__;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE std::string App::help(std::string prev, AppFormatMode mode) const {
    if(prev.empty())
        prev = get_name();
    else
        prev += " " + get_name();

    // Delegate to subcommand if needed
    auto selected_subcommands = get_subcommands();
    if(!selected_subcommands.empty()) {
        return selected_subcommands.back()->help(prev, mode);
    }
    return formatter_->make_help(this, prev, mode);
}